

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

OnigCodePoint enc_sb_out(OnigEncoding enc)

{
  OnigEncoding enc_local;
  
  if ((enc->flag & 2) == 0) {
    enc_local._4_4_ = 0x100;
  }
  else if (enc->min_enc_len == 1) {
    enc_local._4_4_ = 0x80;
  }
  else {
    enc_local._4_4_ = 0;
  }
  return enc_local._4_4_;
}

Assistant:

static OnigCodePoint enc_sb_out(OnigEncoding enc)
{
  if (ONIGENC_IS_UNICODE_ENCODING(enc)) {
    if (ONIGENC_MBC_MINLEN(enc) == 1)
      return ASCII_LIMIT + 1;
    else
      return 0;
  }
  else {
      return 0x100;
  }
}